

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesGenerator.cxx
# Opt level: O1

void __thiscall cmInstallFilesGenerator::~cmInstallFilesGenerator(cmInstallFilesGenerator *this)

{
  ~cmInstallFilesGenerator(this);
  operator_delete(this,0x130);
  return;
}

Assistant:

cmInstallFilesGenerator::~cmInstallFilesGenerator() = default;